

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O1

PSpriteAmiga __thiscall DataSourceAmiga::get_hud_sprite(DataSourceAmiga *this,size_t index)

{
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  PBuffer *data_00;
  PSpriteAmiga PVar2;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  PBuffer data;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  data_00 = *(PBuffer **)(index + 0x1a8);
  Buffer::get_tail((Buffer *)&data,(size_t)data_00);
  local_38 = data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30 = data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
           = (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      UNLOCK();
    }
    else {
      (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
           = (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
    }
  }
  PVar2 = decode_interlased_sprite
                    (this,data_00,(size_t)&local_38,
                     hud_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[in_RDX * 4 + 2],
                     (uint8_t)hud_offsets.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[in_RDX * 4 + 3],'\x10',
                     (uint8_t *)0x0,0x159f80);
  _Var1 = PVar2.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    _Var1._M_pi = extraout_RDX;
  }
  if (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  PVar2.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  PVar2.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (PSpriteAmiga)
         PVar2.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::get_hud_sprite(size_t index) {
  PBuffer data = data_pointers[18]->get_tail(hud_offsets[index*4]);

  return decode_interlased_sprite(data, hud_offsets[index * 4 + 2],
                                  hud_offsets[index * 4 + 3], 16, 0, palette2);
}